

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::QualifierOrderUniformTest::testInit(QualifierOrderUniformTest *this)

{
  vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
  *this_00;
  bool bVar1;
  pointer pQVar2;
  QUALIFIERS *pQVar3;
  iterator iVar4;
  pointer this_01;
  QUALIFIERS local_1c;
  
  bVar1 = (this->super_GLSLTestBase).super_TestBase.m_is_explicit_uniform_location;
  if (bVar1 != false) {
    this_00 = &this->m_test_cases;
    std::
    vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
    ::resize(this_00,4);
    this_01 = (this->m_test_cases).
              super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_HIGHP;
    iVar4._M_current =
         (this_01->
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = (this_01->
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar4._M_current == pQVar2) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           (this_01->
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      pQVar2 = (this_01->
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_HIGHP;
      iVar4._M_current = iVar4._M_current + 1;
      (this_01->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_UNIFORM;
    if (iVar4._M_current == pQVar2) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           (this_01->
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      pQVar2 = (this_01->
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_UNIFORM;
      iVar4._M_current = iVar4._M_current + 1;
      (this_01->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_LOCATION;
    if (iVar4._M_current == pQVar2) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *iVar4._M_current = QUAL_LOCATION;
      (this_01->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    local_1c = QUAL_LOWP;
    iVar4._M_current =
         this_01[1].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar3 = this_01[1].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 1,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           this_01[1].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3 = this_01[1].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_LOWP;
      iVar4._M_current = iVar4._M_current + 1;
      this_01[1].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_UNIFORM;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 1,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           this_01[1].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3 = this_01[1].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_UNIFORM;
      iVar4._M_current = iVar4._M_current + 1;
      this_01[1].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_LOCATION;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 1,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *iVar4._M_current = QUAL_LOCATION;
      this_01[1].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    local_1c = QUAL_HIGHP;
    iVar4._M_current =
         this_01[2].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar3 = this_01[2].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 2,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           this_01[2].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3 = this_01[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_HIGHP;
      iVar4._M_current = iVar4._M_current + 1;
      this_01[2].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_LOCATION;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 2,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           this_01[2].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3 = this_01[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_LOCATION;
      iVar4._M_current = iVar4._M_current + 1;
      this_01[2].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_UNIFORM;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 2,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           this_01[2].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3 = this_01[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_UNIFORM;
      iVar4._M_current = iVar4._M_current + 1;
      this_01[2].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_LOCATION;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 2,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *iVar4._M_current = QUAL_LOCATION;
      this_01[2].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    local_1c = QUAL_LOCATION;
    iVar4._M_current =
         this_01[3].
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pQVar3 = this_01[3].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 3,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           this_01[3].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3 = this_01[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_LOCATION;
      iVar4._M_current = iVar4._M_current + 1;
      this_01[3].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_LOWP;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 3,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           this_01[3].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3 = this_01[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_LOWP;
      iVar4._M_current = iVar4._M_current + 1;
      this_01[3].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_UNIFORM;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 3,iVar4,&local_1c);
      this_01 = (this_00->
                super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           this_01[3].
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3 = this_01[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = QUAL_UNIFORM;
      iVar4._M_current = iVar4._M_current + 1;
      this_01[3].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1c = QUAL_LOCATION;
    if (iVar4._M_current == pQVar3) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(this_01 + 3,iVar4,&local_1c);
    }
    else {
      *iVar4._M_current = QUAL_LOCATION;
      this_01[3].
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
  }
  return bVar1;
}

Assistant:

bool QualifierOrderUniformTest::testInit()
{
	if (false == m_is_explicit_uniform_location)
	{
		return false;
	}

	m_test_cases.resize(4);

	m_test_cases[0].push_back(Utils::QUAL_HIGHP);
	m_test_cases[0].push_back(Utils::QUAL_UNIFORM);
	m_test_cases[0].push_back(Utils::QUAL_LOCATION);

	m_test_cases[1].push_back(Utils::QUAL_LOWP);
	m_test_cases[1].push_back(Utils::QUAL_UNIFORM);
	m_test_cases[1].push_back(Utils::QUAL_LOCATION);

	m_test_cases[2].push_back(Utils::QUAL_HIGHP);
	m_test_cases[2].push_back(Utils::QUAL_LOCATION);
	m_test_cases[2].push_back(Utils::QUAL_UNIFORM);
	m_test_cases[2].push_back(Utils::QUAL_LOCATION);

	m_test_cases[3].push_back(Utils::QUAL_LOCATION);
	m_test_cases[3].push_back(Utils::QUAL_LOWP);
	m_test_cases[3].push_back(Utils::QUAL_UNIFORM);
	m_test_cases[3].push_back(Utils::QUAL_LOCATION);

	return true;
}